

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

void * Js::InterpreterStackFrame::GetAsmJsInterpreterEntryPoint(AsmJsCallStackLayout *stack)

{
  code *pcVar1;
  bool bVar2;
  Which WVar3;
  uint uVar4;
  FunctionBody *this;
  undefined4 *puVar5;
  undefined *puVar6;
  AsmJsRetType local_14;
  
  this = JavascriptFunction::GetFunctionBody(stack->functionObject);
  FunctionProxy::GetAuxPtr((FunctionProxy *)this,AsmJsFunctionInfo);
  WVar3 = AsmJsRetType::which(&local_14);
  uVar4 = WVar3 - Int64;
  if ((uVar4 < 0x18) && ((0xfff207U >> (uVar4 & 0x1f) & 1) != 0)) {
    puVar6 = (&PTR_AsmJsInterpreter<long>_014e9540)[uVar4];
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x904,"((0))","(0)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
    puVar6 = (undefined *)0x0;
  }
  return puVar6;
}

Assistant:

void * InterpreterStackFrame::GetAsmJsInterpreterEntryPoint(AsmJsCallStackLayout* stack)
    {
        JavascriptFunction * function = stack->functionObject;
        void * entryPoint = nullptr;
        switch (function->GetFunctionBody()->GetAsmJsFunctionInfo()->GetReturnType().which())
        {
        case Js::AsmJsRetType::Double:
        {
            entryPoint = (void*)(AsmJsInterpreterDoubleEP)Js::InterpreterStackFrame::AsmJsInterpreter < double >;
            break;
        }
        case Js::AsmJsRetType::Float:
        {
            entryPoint = (void*)(AsmJsInterpreterFloatEP)Js::InterpreterStackFrame::AsmJsInterpreter < float >;
            break;
        }
        case Js::AsmJsRetType::Signed:
        case Js::AsmJsRetType::Void:
        {
            entryPoint = (void*)(AsmJsInterpreterIntEP)Js::InterpreterStackFrame::AsmJsInterpreter < int >;
            break;
        }
        case Js::AsmJsRetType::Int64:
        {
            entryPoint = (void*)(AsmJsInterpreterInt64EP)Js::InterpreterStackFrame::AsmJsInterpreter < int64 >;
            break;
        }
#ifdef ENABLE_WASM_SIMD
        case Js::AsmJsRetType::Int32x4:
        case Js::AsmJsRetType::Bool32x4:
        case Js::AsmJsRetType::Bool16x8:
        case Js::AsmJsRetType::Bool8x16:
        case Js::AsmJsRetType::Float32x4:
        case Js::AsmJsRetType::Float64x2:
        case Js::AsmJsRetType::Int16x8:
        case Js::AsmJsRetType::Int8x16:
        case Js::AsmJsRetType::Uint32x4:
        case Js::AsmJsRetType::Uint16x8:
        case Js::AsmJsRetType::Uint8x16:
        {
            entryPoint = (void*)Js::InterpreterStackFrame::AsmJsInterpreterSimdJs;
            break;
        }
#endif
        default:
            Assume(UNREACHED);
        }
        return entryPoint;
    }